

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

bool __thiscall
QHttpNetworkConnectionPrivate::shouldEmitChannelError
          (QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  QObject *obj;
  char cVar1;
  bool bVar2;
  int iVar3;
  NetworkLayerPreferenceState NVar4;
  QHttpNetworkConnectionChannel *pQVar5;
  int __fd;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  obj = *(QObject **)&this->field_0x8;
  iVar3 = indexOf(this,socket);
  __fd = (int)socket;
  cVar1 = QTimer::isActive();
  if (cVar1 != '\0') {
    QTimer::stop();
    QHttpNetworkConnectionChannel::ensureConnection
              ((QHttpNetworkConnectionChannel *)(this->channels + (iVar3 == 0)));
  }
  NVar4 = this->networkLayerState;
  if (this->activeChannelCount < this->channelCount) {
    if ((NVar4 == IPv4or6) || (NVar4 == HostLookupPending)) {
      this->networkLayerState = Unknown;
    }
    pQVar5 = this->channels;
LAB_001e9abd:
    QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)pQVar5,__fd);
LAB_001e9ac2:
    bVar2 = true;
  }
  else {
    switch(NVar4) {
    case HostLookupPending:
    case IPv4or6:
      bVar2 = QHttpNetworkConnectionChannel::isSocketBusy
                        ((QHttpNetworkConnectionChannel *)(this->channels + (iVar3 == 0)));
      pQVar5 = this->channels;
      if ((bVar2) && (pQVar5[iVar3 == 0].state != ClosingState)) {
        QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)(pQVar5 + iVar3),__fd)
        ;
        bVar2 = false;
        goto LAB_001e9b31;
      }
      this->networkLayerState = Unknown;
      pQVar5 = pQVar5 + iVar3;
      goto LAB_001e9abd;
    case IPv4:
      pQVar5 = this->channels;
      if (pQVar5[iVar3].networkLayerPreference != IPv4Protocol) goto LAB_001e9b02;
      goto LAB_001e9ac2;
    case IPv6:
      pQVar5 = this->channels;
      bVar2 = true;
      if (pQVar5[iVar3].networkLayerPreference == IPv6Protocol) goto LAB_001e9b31;
LAB_001e9b02:
      QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)(pQVar5 + iVar3),__fd);
      QMetaObject::invokeMethod<>(obj,"_q_startNextRequest",QueuedConnection);
      NVar4 = this->networkLayerState;
      bVar2 = false;
      break;
    default:
      bVar2 = true;
    }
    if (NVar4 == Unknown) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_50[0x14] = '\0';
      local_50[0x15] = '\0';
      local_50[0x16] = '\0';
      local_50[0x17] = '\0';
      local_50[4] = '\0';
      local_50[5] = '\0';
      local_50[6] = '\0';
      local_50[7] = '\0';
      local_50[8] = '\0';
      local_50[9] = '\0';
      local_50[10] = '\0';
      local_50[0xb] = '\0';
      local_50[0xc] = '\0';
      local_50[0xd] = '\0';
      local_50[0xe] = '\0';
      local_50[0xf] = '\0';
      local_50[0x10] = '\0';
      local_50[0x11] = '\0';
      local_50[0x12] = '\0';
      local_50[0x13] = '\0';
      local_38 = "default";
      QMessageLogger::warning
                (local_50,"We got a connection error when networkLayerState is Unknown");
    }
  }
LAB_001e9b31:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHttpNetworkConnectionPrivate::shouldEmitChannelError(QIODevice *socket)
{
    Q_Q(QHttpNetworkConnection);

    bool emitError = true;
    int i = indexOf(socket);
    int otherSocket = (i == 0 ? 1 : 0);

    // If the IPv4 connection still isn't started we need to start it now.
    if (delayedConnectionTimer.isActive()) {
        delayedConnectionTimer.stop();
        channels[otherSocket].ensureConnection();
    }

    if (activeChannelCount < channelCount) {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6)
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        channels[0].close();
        emitError = true;
    } else {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6) {
            if (channels[otherSocket].isSocketBusy() && (channels[otherSocket].state != QHttpNetworkConnectionChannel::ClosingState)) {
                // this was the first socket to fail.
                channels[i].close();
                emitError = false;
            }
            else {
                // Both connection attempts has failed.
                networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
                channels[i].close();
                emitError = true;
            }
        } else {
            if (((networkLayerState == QHttpNetworkConnectionPrivate::IPv4) && (channels[i].networkLayerPreference != QAbstractSocket::IPv4Protocol))
                || ((networkLayerState == QHttpNetworkConnectionPrivate::IPv6) && (channels[i].networkLayerPreference != QAbstractSocket::IPv6Protocol))) {
                // First connection worked so this is the second one to complete and it failed.
                channels[i].close();
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                emitError = false;
            }
            if (networkLayerState == QHttpNetworkConnectionPrivate::Unknown)
                qWarning("We got a connection error when networkLayerState is Unknown");
        }
    }
    return emitError;
}